

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecIso.c
# Opt level: O0

int Gia_ManIsoEqual(int Id0,int Id1,uint *pStore,int nWords)

{
  uint *puVar1;
  uint *puVar2;
  int local_3c;
  int w;
  uint *pInfo1;
  uint *pInfo0;
  int nWords_local;
  uint *pStore_local;
  int Id1_local;
  int Id0_local;
  
  puVar1 = Cec_ManIsoInfo(pStore,nWords,Id0);
  puVar2 = Cec_ManIsoInfo(pStore,nWords,Id1);
  local_3c = 0;
  while( true ) {
    if (nWords <= local_3c) {
      return 1;
    }
    if (puVar1[local_3c] != puVar2[local_3c]) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

static inline int Gia_ManIsoEqual( int Id0, int Id1, unsigned * pStore, int nWords )
{
    unsigned * pInfo0 = Cec_ManIsoInfo( pStore, nWords, Id0 );
    unsigned * pInfo1 = Cec_ManIsoInfo( pStore, nWords, Id1 );
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pInfo0[w] != pInfo1[w] )
            return 0;
    return 1;
}